

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::VicinityGroup> *
metaf::VicinityGroup::parse
          (optional<metaf::VicinityGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  _Optional_payload<metaf::VicinityGroup,_true,_true,_true> *p_Var1;
  int iVar2;
  IncompleteType IVar3;
  bool bVar4;
  Type TVar5;
  
  bVar4 = false;
  TVar5 = THUNDERSTORM;
  if (reportPart == RMK) {
    iVar2 = std::__cxx11::string::compare((char *)group);
    IVar3 = EXPECT_DIST_DIR1;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)group);
      if (iVar2 == 0) {
        TVar5 = CUMULONIMBUS;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)group);
        IVar3 = EXPECT_DIST_DIR1;
        if (iVar2 == 0) {
          TVar5 = CUMULONIMBUS_MAMMATUS;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)group);
          if (iVar2 == 0) {
            TVar5 = ALTOCUMULUS_CASTELLANUS;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)group);
            if (iVar2 == 0) {
              TVar5 = TOWERING_CUMULUS;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)group);
              if (iVar2 == 0) {
                TVar5 = STRATOCUMULUS_STANDING_LENTICULAR;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)group);
                if (iVar2 == 0) {
                  TVar5 = ALTOCUMULUS_STANDING_LENTICULAR;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)group);
                  if (iVar2 == 0) {
                    TVar5 = CIRROCUMULUS_STANDING_LENTICULAR;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)group);
                    if (iVar2 == 0) {
                      IVar3 = EXPECT_CLD;
                      TVar5 = ROTOR_CLOUD;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)group);
                      if (iVar2 == 0) {
                        TVar5 = VIRGA;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)group);
                        if (iVar2 == 0) {
                          TVar5 = PRECIPITATION_IN_VICINITY;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)group);
                          TVar5 = FOG;
                          if (iVar2 != 0) {
                            iVar2 = std::__cxx11::string::compare((char *)group);
                            if (iVar2 != 0) {
                              iVar2 = std::__cxx11::string::compare((char *)group);
                              TVar5 = HAZE;
                              if (iVar2 != 0) {
                                iVar2 = std::__cxx11::string::compare((char *)group);
                                if (iVar2 != 0) {
                                  iVar2 = std::__cxx11::string::compare((char *)group);
                                  TVar5 = SMOKE;
                                  if (iVar2 != 0) {
                                    iVar2 = std::__cxx11::string::compare((char *)group);
                                    if (iVar2 != 0) {
                                      iVar2 = std::__cxx11::string::compare((char *)group);
                                      if (iVar2 == 0) {
                                        TVar5 = BLOWING_SNOW;
                                      }
                                      else {
                                        iVar2 = std::__cxx11::string::compare((char *)group);
                                        if (iVar2 == 0) {
                                          TVar5 = BLOWING_DUST;
                                        }
                                        else {
                                          iVar2 = std::__cxx11::string::compare((char *)group);
                                          if (iVar2 == 0) {
                                            TVar5 = BLOWING_SAND;
                                          }
                                          else {
                                            iVar2 = std::__cxx11::string::compare((char *)group);
                                            if (iVar2 == 0) {
                                              TVar5 = FOG_SHALLOW;
                                            }
                                            else {
                                              iVar2 = std::__cxx11::string::compare((char *)group);
                                              if (iVar2 != 0) {
                                                bVar4 = false;
                                                goto LAB_001b3811;
                                              }
                                              TVar5 = FOG_PATCHES;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.t = TVar5;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.dist.distModifier = NONE;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0xc) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.dist.distUnit = METERS;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x1c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x28) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x34) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x40) = 0;
    p_Var1 = &(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
              _M_payload;
    *(uint *)((long)&(p_Var1->super__Optional_payload_base<metaf::VicinityGroup>)._M_payload + 0x44)
         = 0;
    *(Type *)((long)&(p_Var1->super__Optional_payload_base<metaf::VicinityGroup>)._M_payload + 0x48)
         = NOT_REPORTED;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.incompleteType = IVar3;
    bVar4 = true;
  }
LAB_001b3811:
  (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::VicinityGroup>._M_engaged = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::optional<VicinityGroup> VicinityGroup::parse(
	const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void) reportMetadata;
	std::optional<VicinityGroup> notRecognised;
	if (reportPart != ReportPart::RMK) return notRecognised;
	if (group == "TS") return VicinityGroup(Type::THUNDERSTORM);
	if (group == "CB") return VicinityGroup(Type::CUMULONIMBUS);
	if (group == "CBMAM") return VicinityGroup(Type::CUMULONIMBUS_MAMMATUS);
	if (group == "ACC") return VicinityGroup(Type::ALTOCUMULUS_CASTELLANUS);
	if (group == "TCU") return VicinityGroup(Type::TOWERING_CUMULUS);
	if (group == "SCSL") return VicinityGroup(Type::STRATOCUMULUS_STANDING_LENTICULAR);
	if (group == "ACSL") return VicinityGroup(Type::ALTOCUMULUS_STANDING_LENTICULAR);
	if (group == "CCSL") return VicinityGroup(Type::CIRROCUMULUS_STANDING_LENTICULAR);
	if (group == "ROTOR") return VicinityGroup(Type::ROTOR_CLOUD);
	if (group == "VIRGA") return VicinityGroup(Type::VIRGA);
	if (group == "VCSH") return VicinityGroup(Type::PRECIPITATION_IN_VICINITY);
	if (group == "FOG" || group == "FG") return VicinityGroup(Type::FOG);
	if (group == "HAZE" || group == "HZ") return VicinityGroup(Type::HAZE);
	if (group == "SMOKE" || group == "FU") return VicinityGroup(Type::SMOKE);
	if (group == "BLSN") return VicinityGroup(Type::BLOWING_SNOW);
	if (group == "BLDU") return VicinityGroup(Type::BLOWING_DUST);
	if (group == "BLSA") return VicinityGroup(Type::BLOWING_SAND);
	if (group == "MIFG") return VicinityGroup(Type::FOG_SHALLOW);
	if (group == "BCFG") return VicinityGroup(Type::FOG_PATCHES);
	return notRecognised;
}